

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_mfsri(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg;
  uint uVar1;
  TCGTemp *pTVar2;
  uintptr_t o_6;
  uintptr_t o_5;
  uint uVar3;
  uintptr_t o_1;
  uint uVar4;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->pr != true) {
    s = ctx->uc->tcg_ctx;
    uVar3 = ctx->opcode >> 0x10 & 0x1f;
    uVar4 = ctx->opcode >> 0x15 & 0x1f;
    pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar2 - (long)s);
    tcg_ctx = ctx->uc->tcg_ctx;
    uVar1 = ctx->opcode >> 0x10 & 0x1f;
    arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    if (uVar1 == 0) {
      if (ctx->sf_mode == false) {
        tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret,arg);
      }
      else if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx + (long)ret),
                          (TCGArg)(arg + (long)tcg_ctx));
      }
    }
    else {
      tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx + (long)ret),
                        (TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[uVar1]),
                        (TCGArg)(arg + (long)tcg_ctx));
      if (ctx->sf_mode == false) {
        tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret,ret);
      }
    }
    tcg_gen_extract_i64_ppc64(s,ret,ret,0x1c,4);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = (TCGTemp *)(ret + (long)s);
    tcg_gen_callN_ppc64(s,helper_load_sr_ppc64,
                        (TCGTemp *)((long)&s->pool_cur + (long)cpu_gpr[uVar4]),2,&local_48);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    if (uVar3 != uVar4 && uVar3 != 0) {
      if (cpu_gpr[uVar3] != cpu_gpr[uVar4]) {
        tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)cpu_gpr[uVar3]),
                          (TCGArg)((long)&s->pool_cur + (long)cpu_gpr[uVar4]));
      }
    }
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mfsri(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    tcg_gen_extract_tl(tcg_ctx, t0, t0, 28, 4);
    gen_helper_load_sr(tcg_ctx, cpu_gpr[rd], tcg_ctx->cpu_env, t0);
    tcg_temp_free(tcg_ctx, t0);
    if (ra != 0 && ra != rd) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rd]);
    }
}